

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

vector<NPC_*,_std::allocator<NPC_*>_> * __thiscall
Map::NPCsInRange(vector<NPC_*,_std::allocator<NPC_*>_> *__return_storage_ptr__,Map *this,uchar x,
                uchar y,uchar range)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  NPC *local_40;
  NPC *npc;
  iterator __end1;
  iterator __begin1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1;
  uchar range_local;
  uchar y_local;
  uchar x_local;
  Map *this_local;
  vector<NPC_*,_std::allocator<NPC_*>_> *npcs;
  
  std::vector<NPC_*,_std::allocator<NPC_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->npcs);
  npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->npcs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                     *)&npc), bVar1) {
    ppNVar3 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
              operator*(&__end1);
    local_40 = *ppNVar3;
    iVar2 = util::path_length((uint)local_40->x,(uint)local_40->y,(uint)x,(uint)y);
    if (iVar2 <= (int)(uint)range) {
      std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back(__return_storage_ptr__,&local_40);
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<NPC *> Map::NPCsInRange(unsigned char x, unsigned char y, unsigned char range)
{
	std::vector<NPC *> npcs;

	UTIL_FOREACH(this->npcs, npc)
	{
		if (util::path_length(npc->x, npc->y, x, y) <= range)
			npcs.push_back(npc);
	}

	return npcs;
}